

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_3_4::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputPart *part)

{
  Data *this_00;
  Header *header;
  DeepScanLineInputPart *local_20;
  
  this_00 = this->_Data;
  local_20 = part;
  header = DeepScanLineInputPart::header(part);
  Data::check_valid(this_00,header);
  std::vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>::
  push_back(&this->_Data->_part,&local_20);
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputPart* part)
{
    _Data->check_valid (part->header ());
    _Data->_part.push_back (part);
}